

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genFindUpperBound
          (string *__return_storage_ptr__,CppGenerator *this,string *rel_name,string *attrName,
          size_t depth,bool parallel)

{
  size_t off;
  size_t off_00;
  size_t off_01;
  size_t off_02;
  CppGenerator *this_00;
  string *returnString;
  string depthString;
  string upperPointer;
  string local_f90;
  string local_f70;
  string local_f50;
  string local_f30;
  string local_f10;
  string local_ef0;
  string local_ed0;
  string local_eb0;
  string local_e90;
  string local_e70;
  string local_e50;
  string local_e30;
  string local_e10;
  string local_df0;
  string local_dd0;
  string local_db0;
  string local_d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::to_string(&local_f90,depth);
  this_00 = (CppGenerator *)rel_name;
  std::__cxx11::string::string((string *)&local_50,(string *)rel_name);
  getUpperPointer(&local_3d0,this_00,&local_50,depth,parallel);
  std::__cxx11::string::~string((string *)&local_50);
  off = depth + 6;
  offset_abi_cxx11_(&local_d90,this,off);
  std::operator+(&local_d70,&local_d90,"min_");
  std::operator+(&local_d50,&local_d70,attrName);
  std::operator+(&local_d30,&local_d50," = ");
  std::operator+(&local_d10,&local_d30,rel_name);
  std::operator+(&local_cf0,&local_d10,"[lowerptr_");
  std::operator+(&local_cd0,&local_cf0,rel_name);
  std::operator+(&local_cb0,&local_cd0,"[");
  std::operator+(&local_c90,&local_cb0,&local_f90);
  std::operator+(&local_c70,&local_c90,"]].");
  std::operator+(&local_c50,&local_c70,attrName);
  std::operator+(&local_c30,&local_c50,";\n");
  offset_abi_cxx11_(&local_db0,this,off);
  std::operator+(&local_c10,&local_c30,&local_db0);
  std::operator+(&local_bf0,&local_c10,"size_t leap = 1;\n");
  offset_abi_cxx11_(&local_dd0,this,off);
  std::operator+(&local_bd0,&local_bf0,&local_dd0);
  std::operator+(&local_bb0,&local_bd0,"while (min_");
  std::operator+(&local_b90,&local_bb0,attrName);
  std::operator+(&local_b70,&local_b90," < max_");
  std::operator+(&local_b50,&local_b70,attrName);
  std::operator+(&local_b30,&local_b50," && ");
  std::operator+(&local_b10,&local_b30,"lowerptr_");
  std::operator+(&local_af0,&local_b10,rel_name);
  std::operator+(&local_ad0,&local_af0,"[");
  std::operator+(&local_ab0,&local_ad0,&local_f90);
  std::operator+(&local_a90,&local_ab0,"] <= ");
  std::operator+(&local_a70,&local_a90,&local_3d0);
  std::operator+(&local_a50,&local_a70,")\n");
  offset_abi_cxx11_(&local_df0,this,off);
  std::operator+(&local_a30,&local_a50,&local_df0);
  std::operator+(&local_a10,&local_a30,"{\n");
  off_00 = depth + 7;
  offset_abi_cxx11_(&local_e10,this,off_00);
  std::operator+(&local_9f0,&local_a10,&local_e10);
  std::operator+(&local_9d0,&local_9f0,"lowerptr_");
  std::operator+(&local_9b0,&local_9d0,rel_name);
  std::operator+(&local_990,&local_9b0,"[");
  std::operator+(&local_970,&local_990,&local_f90);
  std::operator+(&local_950,&local_970,"] += leap;\n");
  offset_abi_cxx11_(&local_e30,this,off_00);
  std::operator+(&local_930,&local_950,&local_e30);
  std::operator+(&local_910,&local_930,"leap *= 2;\n");
  offset_abi_cxx11_(&local_e50,this,off_00);
  std::operator+(&local_8f0,&local_910,&local_e50);
  std::operator+(&local_8d0,&local_8f0,"if(lowerptr_");
  std::operator+(&local_8b0,&local_8d0,rel_name);
  std::operator+(&local_890,&local_8b0,"[");
  std::operator+(&local_870,&local_890,&local_f90);
  std::operator+(&local_850,&local_870,"] < ");
  std::operator+(&local_830,&local_850,&local_3d0);
  std::operator+(&local_810,&local_830,")\n");
  offset_abi_cxx11_(&local_e70,this,off_00);
  std::operator+(&local_7f0,&local_810,&local_e70);
  std::operator+(&local_7d0,&local_7f0,"{\n");
  off_01 = depth + 8;
  offset_abi_cxx11_(&local_e90,this,off_01);
  std::operator+(&local_7b0,&local_7d0,&local_e90);
  std::operator+(&local_790,&local_7b0,"min_");
  std::operator+(&local_770,&local_790,attrName);
  std::operator+(&local_750,&local_770," = ");
  std::operator+(&local_730,&local_750,rel_name);
  std::operator+(&local_710,&local_730,"[lowerptr_");
  std::operator+(&local_6f0,&local_710,rel_name);
  std::operator+(&local_6d0,&local_6f0,"[");
  std::operator+(&local_6b0,&local_6d0,&local_f90);
  std::operator+(&local_690,&local_6b0,"]].");
  std::operator+(&local_670,&local_690,attrName);
  std::operator+(&local_650,&local_670,";\n");
  offset_abi_cxx11_(&local_eb0,this,off_00);
  std::operator+(&local_630,&local_650,&local_eb0);
  std::operator+(&local_610,&local_630,"}\n");
  offset_abi_cxx11_(&local_ed0,this,off_00);
  std::operator+(&local_5f0,&local_610,&local_ed0);
  std::operator+(&local_5d0,&local_5f0,"else\n");
  offset_abi_cxx11_(&local_ef0,this,off_00);
  std::operator+(&local_5b0,&local_5d0,&local_ef0);
  std::operator+(&local_590,&local_5b0,"{\n");
  offset_abi_cxx11_(&local_f10,this,off_01);
  std::operator+(&local_570,&local_590,&local_f10);
  std::operator+(&local_550,&local_570,"lowerptr_");
  std::operator+(&local_530,&local_550,rel_name);
  std::operator+(&local_510,&local_530,"[");
  std::operator+(&local_4f0,&local_510,&local_f90);
  std::operator+(&local_4d0,&local_4f0,"] = ");
  std::operator+(&local_4b0,&local_4d0,&local_3d0);
  std::operator+(&local_490,&local_4b0,";\n");
  offset_abi_cxx11_(&local_f30,this,off_01);
  std::operator+(&local_470,&local_490,&local_f30);
  std::operator+(&local_450,&local_470,"break;\n");
  offset_abi_cxx11_(&local_f50,this,off_00);
  std::operator+(&local_430,&local_450,&local_f50);
  std::operator+(&local_410,&local_430,"}\n");
  offset_abi_cxx11_(&local_f70,this,off);
  std::operator+(&local_3f0,&local_410,&local_f70);
  std::operator+(__return_storage_ptr__,&local_3f0,"}\n");
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_f70);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_f50);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_f30);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_f10);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_ef0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_ed0);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_eb0);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::~string((string *)&local_e70);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::~string((string *)&local_830);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_e50);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_e30);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_e10);
  std::__cxx11::string::~string((string *)&local_a10);
  std::__cxx11::string::~string((string *)&local_a30);
  std::__cxx11::string::~string((string *)&local_df0);
  std::__cxx11::string::~string((string *)&local_a50);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::~string((string *)&local_a90);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_b10);
  std::__cxx11::string::~string((string *)&local_b30);
  std::__cxx11::string::~string((string *)&local_b50);
  std::__cxx11::string::~string((string *)&local_b70);
  std::__cxx11::string::~string((string *)&local_b90);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::__cxx11::string::~string((string *)&local_bd0);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::__cxx11::string::~string((string *)&local_c10);
  std::__cxx11::string::~string((string *)&local_db0);
  std::__cxx11::string::~string((string *)&local_c30);
  std::__cxx11::string::~string((string *)&local_c50);
  std::__cxx11::string::~string((string *)&local_c70);
  std::__cxx11::string::~string((string *)&local_c90);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::__cxx11::string::~string((string *)&local_cd0);
  std::__cxx11::string::~string((string *)&local_cf0);
  std::__cxx11::string::~string((string *)&local_d10);
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string((string *)&local_d50);
  std::__cxx11::string::~string((string *)&local_d70);
  std::__cxx11::string::~string((string *)&local_d90);
  offset_abi_cxx11_(&local_f0,this,off);
  std::operator+(&local_d0,&local_f0,"/* Backtrack with binary search */\n");
  offset_abi_cxx11_(&local_110,this,off);
  std::operator+(&local_b0,&local_d0,&local_110);
  std::operator+(&local_90,&local_b0,"if (leap > 2 && max_");
  std::operator+(&local_70,&local_90,attrName);
  std::operator+(&local_f70,&local_70," <= ");
  std::operator+(&local_f50,&local_f70,rel_name);
  std::operator+(&local_f30,&local_f50,"[lowerptr_");
  std::operator+(&local_f10,&local_f30,rel_name);
  std::operator+(&local_ef0,&local_f10,"[");
  std::operator+(&local_ed0,&local_ef0,&local_f90);
  std::operator+(&local_eb0,&local_ed0,"]].");
  std::operator+(&local_e90,&local_eb0,attrName);
  std::operator+(&local_e70,&local_e90,")\n");
  offset_abi_cxx11_(&local_130,this,off);
  std::operator+(&local_e50,&local_e70,&local_130);
  std::operator+(&local_e30,&local_e50,"{\n");
  offset_abi_cxx11_(&local_150,this,off_00);
  std::operator+(&local_e10,&local_e30,&local_150);
  std::operator+(&local_df0,&local_e10,"leap /= 2;\n");
  offset_abi_cxx11_(&local_170,this,off_00);
  std::operator+(&local_dd0,&local_df0,&local_170);
  std::operator+(&local_db0,&local_dd0,"size_t high = lowerptr_");
  std::operator+(&local_d90,&local_db0,rel_name);
  std::operator+(&local_d70,&local_d90,"[");
  std::operator+(&local_d50,&local_d70,&local_f90);
  std::operator+(&local_d30,&local_d50,"], low = ");
  std::operator+(&local_d10,&local_d30,"lowerptr_");
  std::operator+(&local_cf0,&local_d10,rel_name);
  std::operator+(&local_cd0,&local_cf0,"[");
  std::operator+(&local_cb0,&local_cd0,&local_f90);
  std::operator+(&local_c90,&local_cb0,"] - leap, mid = 0;\n");
  offset_abi_cxx11_(&local_190,this,off_00);
  std::operator+(&local_c70,&local_c90,&local_190);
  std::operator+(&local_c50,&local_c70,"while (high > low && high != low)\n");
  offset_abi_cxx11_(&local_1b0,this,off_00);
  std::operator+(&local_c30,&local_c50,&local_1b0);
  std::operator+(&local_c10,&local_c30,"{\n");
  offset_abi_cxx11_(&local_1d0,this,off_01);
  std::operator+(&local_bf0,&local_c10,&local_1d0);
  std::operator+(&local_bd0,&local_bf0,"mid = (high + low) / 2;\n");
  offset_abi_cxx11_(&local_1f0,this,off_01);
  std::operator+(&local_bb0,&local_bd0,&local_1f0);
  std::operator+(&local_b90,&local_bb0,"if (max_");
  std::operator+(&local_b70,&local_b90,attrName);
  std::operator+(&local_b50,&local_b70," > ");
  std::operator+(&local_b30,&local_b50,rel_name);
  std::operator+(&local_b10,&local_b30,"[mid - 1].");
  std::operator+(&local_af0,&local_b10,attrName);
  std::operator+(&local_ad0,&local_af0," && ");
  std::operator+(&local_ab0,&local_ad0,"max_");
  std::operator+(&local_a90,&local_ab0,attrName);
  std::operator+(&local_a70,&local_a90," <= ");
  std::operator+(&local_a50,&local_a70,rel_name);
  std::operator+(&local_a30,&local_a50,"[mid].");
  std::operator+(&local_a10,&local_a30,attrName);
  std::operator+(&local_9f0,&local_a10,")\n");
  offset_abi_cxx11_(&local_210,this,off_01);
  std::operator+(&local_9d0,&local_9f0,&local_210);
  std::operator+(&local_9b0,&local_9d0,"{\n");
  off_02 = depth + 9;
  offset_abi_cxx11_(&local_230,this,off_02);
  std::operator+(&local_990,&local_9b0,&local_230);
  std::operator+(&local_970,&local_990,"lowerptr_");
  std::operator+(&local_950,&local_970,rel_name);
  std::operator+(&local_930,&local_950,"[");
  std::operator+(&local_910,&local_930,&local_f90);
  std::operator+(&local_8f0,&local_910,"] = mid;\n");
  offset_abi_cxx11_(&local_250,this,off_02);
  std::operator+(&local_8d0,&local_8f0,&local_250);
  std::operator+(&local_8b0,&local_8d0,"break;\n");
  offset_abi_cxx11_(&local_270,this,off_01);
  std::operator+(&local_890,&local_8b0,&local_270);
  std::operator+(&local_870,&local_890,"}\n");
  offset_abi_cxx11_(&local_290,this,off_01);
  std::operator+(&local_850,&local_870,&local_290);
  std::operator+(&local_830,&local_850,"else if (max_");
  std::operator+(&local_810,&local_830,attrName);
  std::operator+(&local_7f0,&local_810," <= ");
  std::operator+(&local_7d0,&local_7f0,rel_name);
  std::operator+(&local_7b0,&local_7d0,"[mid].");
  std::operator+(&local_790,&local_7b0,attrName);
  std::operator+(&local_770,&local_790,")\n");
  offset_abi_cxx11_(&local_2b0,this,off_02);
  std::operator+(&local_750,&local_770,&local_2b0);
  std::operator+(&local_730,&local_750,"high = mid - 1;\n");
  offset_abi_cxx11_(&local_2d0,this,off_01);
  std::operator+(&local_710,&local_730,&local_2d0);
  std::operator+(&local_6f0,&local_710,"else \n");
  offset_abi_cxx11_(&local_2f0,this,off_02);
  std::operator+(&local_6d0,&local_6f0,&local_2f0);
  std::operator+(&local_6b0,&local_6d0,"low = mid + 1;\n");
  offset_abi_cxx11_(&local_310,this,off_00);
  std::operator+(&local_690,&local_6b0,&local_310);
  std::operator+(&local_670,&local_690,"}\n");
  offset_abi_cxx11_(&local_330,this,off_00);
  std::operator+(&local_650,&local_670,&local_330);
  std::operator+(&local_630,&local_650,"mid = (high + low) / 2;\n");
  offset_abi_cxx11_(&local_350,this,off_00);
  std::operator+(&local_610,&local_630,&local_350);
  std::operator+(&local_5f0,&local_610,"if (");
  std::operator+(&local_5d0,&local_5f0,rel_name);
  std::operator+(&local_5b0,&local_5d0,"[mid-1].");
  std::operator+(&local_590,&local_5b0,attrName);
  std::operator+(&local_570,&local_590," >= max_");
  std::operator+(&local_550,&local_570,attrName);
  std::operator+(&local_530,&local_550,")\n");
  offset_abi_cxx11_(&local_370,this,off_01);
  std::operator+(&local_510,&local_530,&local_370);
  std::operator+(&local_4f0,&local_510,"mid -= 1;\n");
  offset_abi_cxx11_(&local_390,this,off_00);
  std::operator+(&local_4d0,&local_4f0,&local_390);
  std::operator+(&local_4b0,&local_4d0,"lowerptr_");
  std::operator+(&local_490,&local_4b0,rel_name);
  std::operator+(&local_470,&local_490,"[");
  std::operator+(&local_450,&local_470,&local_f90);
  std::operator+(&local_430,&local_450,"] = mid;\n");
  offset_abi_cxx11_(&local_3b0,this,off);
  std::operator+(&local_410,&local_430,&local_3b0);
  std::operator+(&local_3f0,&local_410,"}\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::~string((string *)&local_830);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_a10);
  std::__cxx11::string::~string((string *)&local_a30);
  std::__cxx11::string::~string((string *)&local_a50);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::~string((string *)&local_a90);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_b10);
  std::__cxx11::string::~string((string *)&local_b30);
  std::__cxx11::string::~string((string *)&local_b50);
  std::__cxx11::string::~string((string *)&local_b70);
  std::__cxx11::string::~string((string *)&local_b90);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_bd0);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_c10);
  std::__cxx11::string::~string((string *)&local_c30);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_c50);
  std::__cxx11::string::~string((string *)&local_c70);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_c90);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::__cxx11::string::~string((string *)&local_cd0);
  std::__cxx11::string::~string((string *)&local_cf0);
  std::__cxx11::string::~string((string *)&local_d10);
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string((string *)&local_d50);
  std::__cxx11::string::~string((string *)&local_d70);
  std::__cxx11::string::~string((string *)&local_d90);
  std::__cxx11::string::~string((string *)&local_db0);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_df0);
  std::__cxx11::string::~string((string *)&local_e10);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_e30);
  std::__cxx11::string::~string((string *)&local_e50);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_e70);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string((string *)&local_eb0);
  std::__cxx11::string::~string((string *)&local_ed0);
  std::__cxx11::string::~string((string *)&local_ef0);
  std::__cxx11::string::~string((string *)&local_f10);
  std::__cxx11::string::~string((string *)&local_f30);
  std::__cxx11::string::~string((string *)&local_f50);
  std::__cxx11::string::~string((string *)&local_f70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_f90);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genFindUpperBound(const std::string& rel_name,
                                            const std::string& attrName,
                                            size_t depth, bool parallel)
{
    const std::string depthString = std::to_string(depth);
    const std::string upperPointer = getUpperPointer(rel_name,depth,parallel);
    
    std::string returnString = offset(6+depth)+"min_"+attrName+" = "+
        rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attrName +";\n"+
        offset(6+depth)+"size_t leap = 1;\n"+
        offset(6+depth)+"while (min_"+attrName+" < max_"+attrName+" && "+
        "lowerptr_"+rel_name+"["+depthString+"] <= "+upperPointer+")\n"+
        offset(6+depth)+"{\n"+
        offset(7+depth)+"lowerptr_"+rel_name+"["+depthString+"] += leap;\n"+
        offset(7+depth)+"leap *= 2;\n"+
        offset(7+depth)+"if(lowerptr_"+rel_name+"["+depthString+
        "] < "+upperPointer+")\n"+offset(7+depth)+"{\n"+
        offset(8+depth)+"min_"+attrName+" = "+rel_name+"[lowerptr_"+rel_name+"["+
        depthString+"]]."+attrName+";\n"+
        offset(7+depth)+"}\n"+offset(7+depth)+"else\n"+offset(7+depth)+"{\n"+
        offset(8+depth)+"lowerptr_"+rel_name+"["+depthString+"] = "+upperPointer+";\n"+
        offset(8+depth)+"break;\n"+
        offset(7+depth)+"}\n"+
        offset(6+depth)+"}\n";

    /*
     * When we found an upper bound; to find the least upper bound;
     * use binary search to backtrack.
     */ 
    returnString += offset(6+depth)+"/* Backtrack with binary search */\n"+
        offset(6+depth)+"if (leap > 2 && max_"+attrName+" <= "+rel_name+
        "[lowerptr_"+rel_name+"["+depthString+"]]."+attrName+")\n"+offset(6+depth)+"{\n"+
        offset(7+depth)+"leap /= 2;\n"+
        offset(7+depth)+"size_t high = lowerptr_"+rel_name+"["+depthString+"], low = "+
        "lowerptr_"+rel_name+"["+depthString+"] - leap, mid = 0;\n"+
        offset(7+depth)+"while (high > low && high != low)\n"+offset(7+depth)+"{\n"+
        offset(8+depth)+"mid = (high + low) / 2;\n"+
        offset(8+depth)+"if (max_"+attrName+" > "+rel_name+"[mid - 1]."+attrName+" && "+
        "max_"+attrName+" <= "+rel_name+"[mid]."+attrName+")\n"+offset(8+depth)+"{\n"+
        offset(9+depth)+"lowerptr_"+rel_name+"["+depthString+"] = mid;\n"+
        offset(9+depth)+"break;\n"+offset(8+depth)+"}\n"+
        offset(8+depth)+"else if (max_"+attrName+" <= "+rel_name+"[mid]."+attrName+")\n"+
        offset(9+depth)+"high = mid - 1;\n"+
        offset(8+depth)+"else \n"+offset(9+depth)+"low = mid + 1;\n"+
        offset(7+depth)+"}\n"+
        offset(7+depth)+"mid = (high + low) / 2;\n"+
        offset(7+depth)+"if ("+rel_name+"[mid-1]."+attrName+" >= max_"+attrName+")\n"+
        offset(8+depth)+"mid -= 1;\n"+
        offset(7+depth)+"lowerptr_"+rel_name+"["+depthString+"] = mid;\n"+
        offset(6+depth)+"}\n";

    return returnString;
}